

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

shared_ptr<gui::Slider> gui::Slider::create(Theme *theme,String *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  String *in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::Slider> sVar1;
  element_type *this;
  Theme *this_00;
  String *in_stack_ffffffffffffffb0;
  Gui *in_stack_ffffffffffffffb8;
  Slider *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  _Base_ptr in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  operator_new(0x260);
  this_00 = (Theme *)&stack0xffffffffffffffb0;
  std::locale::locale((locale *)this_00);
  sf::String::String((String *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     (locale *)in_stack_ffffffffffffffc0);
  Theme::getStyle<gui::SliderStyle>(this_00,in_RSI);
  Slider(in_stack_ffffffffffffffc0,(shared_ptr<gui::SliderStyle> *)in_stack_ffffffffffffffb8,
         in_stack_ffffffffffffffb0);
  std::shared_ptr<gui::Slider>::shared_ptr<gui::Slider,void>((shared_ptr<gui::Slider> *)this,in_RDI)
  ;
  std::shared_ptr<gui::SliderStyle>::~shared_ptr((shared_ptr<gui::SliderStyle> *)0x1d6835);
  sf::String::~String((String *)0x1d683f);
  std::locale::~locale((locale *)&stack0xffffffffffffffb0);
  sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::Slider>)sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Slider> Slider::create(const Theme& theme, const sf::String& name) {
    return std::shared_ptr<Slider>(new Slider(theme.getStyle<SliderStyle>("Slider"), name));
}